

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbannouncer.cpp
# Opt level: O1

bool AnnounceKill(AActor *killer,AActor *killee)

{
  Node *pNVar1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  char *from;
  Node *pNVar8;
  Node *pNVar9;
  char *killer_00;
  SoundAndString *pSVar10;
  char assembled [1024];
  char acStack_438 [1032];
  
  uVar5 = FRandom::GenRand32(&pr_bbannounce);
  bVar4 = false;
  if ((cl_bbannounce.Value == true) && (bVar4 = false, deathmatch.Value != 0)) {
    bVar3 = AActor::CheckLocalView(killee,consoleplayer);
    if (killer == (AActor *)0x0) {
      puVar2 = (undefined8 *)
               ((long)&((killee->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((killee->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x209) * 0x18));
      do {
        puVar6 = puVar2;
        puVar2 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x209);
      if (*(int *)(puVar6[2] + 0x28) == 0) {
        uVar5 = (uVar5 & 0xff) % 3;
      }
      else {
        uVar5 = uVar5 & 1;
      }
      pSVar10 = WorldKillSounds + uVar5;
      killer_00 = (char *)0x0;
    }
    else if (killer == killee) {
      puVar2 = (undefined8 *)
               ((long)&((killer->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((killer->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x1ea) * 0x18));
      do {
        puVar6 = puVar2;
        puVar2 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x1ea);
      pSVar10 = (SoundAndString *)((long)&SuicideSounds[0].Message + (ulong)((uVar5 & 3) << 4));
      killer_00 = *(char **)(puVar6[2] + 0x28);
    }
    else {
      puVar2 = (undefined8 *)
               ((long)&((killee->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((killee->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x209) * 0x18));
      do {
        puVar6 = puVar2;
        puVar2 = (undefined8 *)*puVar6;
      } while (*(int *)(puVar6 + 1) != 0x209);
      puVar2 = (undefined8 *)
               ((long)&((killer->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                       .Nodes)->Next +
               (ulong)(((killer->player->userinfo).
                        super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                        .Size - 1 & 0x1ea) * 0x18));
      do {
        puVar7 = puVar2;
        puVar2 = (undefined8 *)*puVar7;
      } while (*(int *)(puVar7 + 1) != 0x1ea);
      pSVar10 = KillSounds +
                (ulong)(uVar5 & 0xff) % (ulong)((*(int *)(puVar6[2] + 0x28) == 0) + 0x1e);
      killer_00 = *(char **)(puVar7[2] + 0x28);
      bVar4 = AActor::CheckLocalView(killer,consoleplayer);
      bVar3 = bVar3 || bVar4;
    }
    from = FStringTable::operator()(&GStrings,pSVar10->Message);
    bVar4 = from != (char *)0x0;
    if (bVar4) {
      pNVar1 = (killee->player->userinfo).
               super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Nodes;
      uVar5 = (killee->player->userinfo).
              super_TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>.Size -
              1;
      pNVar8 = pNVar1 + (uVar5 & 0x209);
      do {
        pNVar9 = pNVar8;
        pNVar8 = pNVar9->Next;
      } while ((pNVar9->Pair).Key.Index != 0x209);
      pNVar1 = pNVar1 + (uVar5 & 0x1ea);
      do {
        pNVar8 = pNVar1;
        pNVar1 = pNVar8->Next;
      } while ((pNVar8->Pair).Key.Index != 0x1ea);
      SexMessage(from,acStack_438,*(int *)&(pNVar9->Pair).Value[1]._vptr_FBaseCVar,
                 (char *)(pNVar8->Pair).Value[1]._vptr_FBaseCVar,killer_00);
      Printf(1,"%s\n",acStack_438);
    }
    if (bVar3 != false) {
      DoVoiceAnnounce(pSVar10->Sound);
    }
  }
  return bVar4;
}

Assistant:

bool AnnounceKill (AActor *killer, AActor *killee)
{
	const char *killerName;
	const SoundAndString *choice;
	const char *message;
	int rannum = pr_bbannounce();

	if (cl_bbannounce && deathmatch)
	{
		bool playSound = killee->CheckLocalView (consoleplayer);

		if (killer == NULL)
		{ // The world killed the player
			if (killee->player->userinfo.GetGender() == GENDER_MALE)
			{ // Only males have scrotums to separate
				choice = &WorldKillSounds[rannum % 3];
			}
			else
			{
				choice = &WorldKillSounds[rannum & 1];
			}
			killerName = NULL;
		}
		else if (killer == killee)
		{ // The player killed self
			choice = &SuicideSounds[rannum & 3];
			killerName = killer->player->userinfo.GetName();
		}
		else
		{ // Another player did the killing
			if (killee->player->userinfo.GetGender() == GENDER_MALE)
			{ // Only males can be castrated
				choice = &KillSounds[rannum % countof(KillSounds)];
			}
			else
			{
				choice = &KillSounds[rannum % (countof(KillSounds) - 1)];
			}
			killerName = killer->player->userinfo.GetName();

			// Blood only plays the announcement sound on the killer's
			// computer. I think it sounds neater to also hear it on
			// the killee's machine.
			playSound |= killer->CheckLocalView (consoleplayer);
		}

		message = GStrings(choice->Message);
		if (message != NULL)
		{
			char assembled[1024];

			SexMessage (message, assembled, killee->player->userinfo.GetGender(),
				killee->player->userinfo.GetName(), killerName);
			Printf (PRINT_MEDIUM, "%s\n", assembled);
		}
		if (playSound)
		{
			DoVoiceAnnounce (choice->Sound);
		}
		return message != NULL;
	}
	return false;
}